

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetMassLSNormFactor(void *arkode_mem,sunrealtype nrmfac)

{
  int iVar1;
  long lVar2;
  int error_code;
  char *msgfmt;
  double dVar3;
  double dVar4;
  ARKLsMassMem arkls_mem;
  double local_18;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x675;
LAB_0013966d:
    arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetMassLSNormFactor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
    return error_code;
  }
  if (*(int *)((long)arkode_mem + 0x1e8) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    error_code = -0x30;
    iVar1 = 0x67e;
    goto LAB_0013966d;
  }
  local_18 = nrmfac;
  iVar1 = arkLs_AccessMassMem((ARKodeMem)arkode_mem,"ARKodeSetMassLSNormFactor",&arkls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (0.0 < local_18) {
    arkls_mem->nrmfac = local_18;
    return 0;
  }
  if (0.0 <= local_18) {
    lVar2 = N_VGetLength(*(undefined8 *)((long)arkode_mem + 0x248));
    if (lVar2 < 1) {
      dVar4 = 0.0;
      goto LAB_001396fb;
    }
    lVar2 = N_VGetLength(*(undefined8 *)((long)arkode_mem + 0x248));
    dVar4 = (double)lVar2;
  }
  else {
    N_VConst(0x3ff0000000000000);
    dVar3 = (double)N_VDotProd(*(undefined8 *)((long)arkode_mem + 0x248),
                               *(undefined8 *)((long)arkode_mem + 0x248));
    dVar4 = 0.0;
    if (dVar3 <= 0.0) goto LAB_001396fb;
    dVar4 = (double)N_VDotProd(*(undefined8 *)((long)arkode_mem + 0x248),
                               *(undefined8 *)((long)arkode_mem + 0x248));
  }
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
LAB_001396fb:
  arkls_mem->nrmfac = dVar4;
  return 0;
}

Assistant:

int ARKodeSetMassLSNormFactor(void* arkode_mem, sunrealtype nrmfac)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structures */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  if (nrmfac > ZERO)
  {
    /* set user-provided factor */
    arkls_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, ark_mem->tempv1);
    arkls_mem->nrmfac = SUNRsqrt(N_VDotProd(ark_mem->tempv1, ark_mem->tempv1));
  }
  else
  {
    /* compute default factor for WRMS norm from vector legnth */
    arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(ark_mem->tempv1));
  }

  return (ARKLS_SUCCESS);
}